

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.h
# Opt level: O2

void __thiscall
cmCacheManager::CacheIterator::CacheIterator(CacheIterator *this,cmCacheManager *cm,char *key)

{
  allocator local_31;
  string local_30;
  
  this->Container = cm;
  (this->Position)._M_node = (_Base_ptr)0x0;
  if (key != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_30,key,&local_31);
    Find(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

CacheIterator(cmCacheManager& cm, const char* key)
      : Container(cm)
    {
      if (key) {
        this->Find(key);
      }
    }